

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

char * __thiscall
rapidxml::memory_pool<char>::allocate_string(memory_pool<char> *this,char *source,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  char *local_30;
  size_t i;
  char *result;
  size_t size_local;
  char *source_local;
  memory_pool<char> *this_local;
  
  if (source == (char *)0x0 && size == 0) {
    __assert_fail("source || size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Joshsora[P]kipy/dependencies/libki/third_party/rapidxml.hpp"
                  ,0x1de,
                  "Ch *rapidxml::memory_pool<>::allocate_string(const Ch *, std::size_t) [Ch = char]"
                 );
  }
  result = (char *)size;
  if (size == 0) {
    sVar1 = internal::measure<char>(source);
    result = (char *)(sVar1 + 1);
  }
  pcVar2 = (char *)allocate_aligned(this,(size_t)result);
  if (source != (char *)0x0) {
    for (local_30 = (char *)0x0; local_30 < result; local_30 = local_30 + 1) {
      pcVar2[(long)local_30] = source[(long)local_30];
    }
  }
  return pcVar2;
}

Assistant:

Ch *allocate_string(const Ch *source = 0, std::size_t size = 0)
        {
            assert(source || size);     // Either source or size (or both) must be specified
            if (size == 0)
                size = internal::measure(source) + 1;
            Ch *result = static_cast<Ch *>(allocate_aligned(size * sizeof(Ch)));
            if (source)
                for (std::size_t i = 0; i < size; ++i)
                    result[i] = source[i];
            return result;
        }